

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v5::internal::
     handle_float_type_spec<fmt::v5::internal::float_type_checker<fmt::v5::internal::error_handler>>
               (char spec,float_type_checker<fmt::v5::internal::error_handler> *handler)

{
  int iVar1;
  uint uVar2;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,spec);
  uVar2 = iVar1 - 0x41;
  if (((0x26 < uVar2) || ((0x7100000071U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) && (iVar1 != 0)) {
    float_type_checker<fmt::v5::internal::error_handler>::on_error(handler);
    return;
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_float_type_spec(char spec, Handler &&handler) {
  switch (spec) {
  case 0: case 'g': case 'G':
    handler.on_general();
    break;
  case 'e': case 'E':
    handler.on_exp();
    break;
  case 'f': case 'F':
    handler.on_fixed();
    break;
   case 'a': case 'A':
    handler.on_hex();
    break;
  default:
    handler.on_error();
    break;
  }
}